

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::emit_complex_bitcast
          (CompilerGLSL *this,uint32_t result_type,uint32_t id,uint32_t op0)

{
  bool forwarding;
  SPIRType *pSVar1;
  char (*in_R8) [3];
  string local_e8;
  string local_c8;
  string local_98;
  string local_78;
  undefined1 local_58 [8];
  string expr;
  SPIRType *input_type;
  SPIRType *output_type;
  uint32_t op0_local;
  uint32_t id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  pSVar1 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  expr.field_2._8_8_ = Compiler::expression_type(&this->super_Compiler,op0);
  ::std::__cxx11::string::string((string *)local_58);
  if (((pSVar1->basetype == Half) && (*(int *)(expr.field_2._8_8_ + 0x10) == 0xd)) &&
     (*(int *)(expr.field_2._8_8_ + 0x18) == 1)) {
    to_unpacked_expression_abi_cxx11_(&local_98,this,op0,true);
    join<char_const(&)[33],std::__cxx11::string,char_const(&)[3]>
              (&local_78,(spirv_cross *)"unpackFloat2x16(floatBitsToUint(",(char (*) [33])&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a5e24,in_R8);
    ::std::__cxx11::string::operator=((string *)local_58,(string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_98);
  }
  else {
    if (((pSVar1->basetype != Float) || (*(int *)(expr.field_2._8_8_ + 0x10) != 0xc)) ||
       (*(int *)(expr.field_2._8_8_ + 0x18) != 2)) {
      this_local._7_1_ = false;
      goto LAB_004830f2;
    }
    to_unpacked_expression_abi_cxx11_(&local_e8,this,op0,true);
    join<char_const(&)[31],std::__cxx11::string,char_const(&)[3]>
              (&local_c8,(spirv_cross *)"uintBitsToFloat(packFloat2x16(",(char (*) [31])&local_e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a5e24,in_R8);
    ::std::__cxx11::string::operator=((string *)local_58,(string *)&local_c8);
    ::std::__cxx11::string::~string((string *)&local_c8);
    ::std::__cxx11::string::~string((string *)&local_e8);
  }
  forwarding = should_forward(this,op0);
  emit_op(this,result_type,id,(string *)local_58,forwarding,false);
  this_local._7_1_ = true;
LAB_004830f2:
  ::std::__cxx11::string::~string((string *)local_58);
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::emit_complex_bitcast(uint32_t result_type, uint32_t id, uint32_t op0)
{
	// Some bitcasts may require complex casting sequences, and are implemented here.
	// Otherwise a simply unary function will do with bitcast_glsl_op.

	auto &output_type = get<SPIRType>(result_type);
	auto &input_type = expression_type(op0);
	string expr;

	if (output_type.basetype == SPIRType::Half && input_type.basetype == SPIRType::Float && input_type.vecsize == 1)
		expr = join("unpackFloat2x16(floatBitsToUint(", to_unpacked_expression(op0), "))");
	else if (output_type.basetype == SPIRType::Float && input_type.basetype == SPIRType::Half &&
	         input_type.vecsize == 2)
		expr = join("uintBitsToFloat(packFloat2x16(", to_unpacked_expression(op0), "))");
	else
		return false;

	emit_op(result_type, id, expr, should_forward(op0));
	return true;
}